

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# barrier_test.cpp
# Opt level: O2

void __thiscall BarrierTest_Ctor_Test::TestBody(BarrierTest_Ctor_Test *this)

{
  bool bVar1;
  undefined8 *local_c0;
  undefined8 local_b8;
  undefined8 local_b0;
  undefined8 uStack_a8;
  barrier<yamc::detail::default_barrier_completion> local_80;
  
  local_c0 = &local_b0;
  local_b0 = 0;
  uStack_a8 = 0;
  local_b8 = 0;
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    yamc::barrier<yamc::detail::default_barrier_completion>::barrier(&local_80,1);
    std::condition_variable::~condition_variable(&local_80.cv_);
  }
  std::__cxx11::string::~string((string *)&local_c0);
  return;
}

Assistant:

TEST(BarrierTest, Ctor)
{
  EXPECT_NO_THROW(yamc::barrier<>{1});
}